

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

wchar_t lzh_make_huffman_table(huffman_conflict *hf)

{
  uint16_t *__dest;
  uint16_t *puVar1;
  ushort uVar2;
  uchar *puVar3;
  short sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  htree_t *phVar12;
  byte bVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  htree_t *phVar16;
  long lVar17;
  ulong uVar18;
  uint16_t uVar19;
  uint16_t *__src;
  wchar_t wVar20;
  ulong uVar21;
  uint uVar22;
  wchar_t wVar23;
  uint16_t *puVar24;
  undefined4 uVar25;
  undefined1 auVar26 [16];
  wchar_t bitptn [17];
  wchar_t weight [17];
  uint uStack_34;
  
  wVar14 = L'\0';
  uVar8 = 0x8000;
  wVar23 = L'\0';
  for (lVar17 = -0x10; lVar17 != 0; lVar17 = lVar17 + 1) {
    weight[lVar17 + -3] = wVar14;
    (&uStack_34)[lVar17] = uVar8;
    wVar14 = wVar14 + hf->freq[lVar17 + 0x11] * uVar8;
    if (hf->freq[lVar17 + 0x11] != L'\0') {
      wVar23 = (int)lVar17 + L'\x11';
    }
    uVar8 = uVar8 >> 1;
  }
  if (wVar14 != L'𐀀') {
    return L'\0';
  }
  if (hf->tbl_bits < wVar23) {
    return L'\0';
  }
  hf->max_bits = wVar23;
  if (wVar23 < L'\x10') {
    bVar13 = 0x10 - (char)wVar23;
    uVar10 = 0;
    uVar18 = 0;
    if (L'\0' < wVar23) {
      uVar18 = (ulong)(uint)wVar23;
    }
    for (; uVar18 != uVar10; uVar10 = uVar10 + 1) {
      bitptn[uVar10 + 1] = bitptn[uVar10 + 1] >> (bVar13 & 0x1f);
      weight[uVar10 + 1] = weight[uVar10 + 1] >> (bVar13 & 0x1f);
    }
    if (wVar23 < L'\v') {
      puVar24 = hf->tbl;
      wVar23 = L'\0';
      goto LAB_00544843;
    }
  }
  wVar23 = wVar23 + L'\xfffffff6';
  for (lVar17 = 1; lVar17 != 0xb; lVar17 = lVar17 + 1) {
    bitptn[lVar17] = bitptn[lVar17] >> ((byte)wVar23 & 0x1f);
    weight[lVar17] = weight[lVar17] >> ((byte)wVar23 & 0x1f);
  }
  puVar24 = hf->tbl;
  for (uVar10 = (ulong)(uint)(hf->freq[10] * weight[10] + bitptn[10]) * 2; uVar10 < 0x800;
      uVar10 = uVar10 + 2) {
    *(undefined2 *)((long)puVar24 + uVar10) = 0;
  }
LAB_00544843:
  hf->shift_bits = wVar23;
  puVar3 = hf->bitlen;
  wVar14 = hf->len_avail;
  hf->tree_used = L'\0';
  uVar10 = 0;
  uVar18 = 0;
  if (L'\0' < wVar14) {
    uVar18 = (ulong)(uint)wVar14;
  }
  do {
    if (uVar10 == uVar18) {
      return L'\x01';
    }
    bVar13 = puVar3[uVar10];
    if (bVar13 != 0) {
      uVar21 = (ulong)((uint)bVar13 * 4);
      uVar8 = *(uint *)((long)bitptn + uVar21);
      uVar22 = *(uint *)((long)weight + uVar21);
      uVar11 = (ulong)uVar22;
      *(uint *)((long)bitptn + uVar21) = uVar22 + uVar8;
      uVar19 = (uint16_t)uVar10;
      if (bVar13 < 0xb) {
        if (0x400 < (int)(uVar22 + uVar8)) {
          return L'\0';
        }
        __dest = puVar24 + (int)uVar8;
        if ((int)uVar22 < 8) {
          lVar17 = uVar11 << 0x20;
          for (; 1 < (int)uVar11; uVar11 = uVar11 - 2) {
            __dest[uVar11 - 1] = uVar19;
            __dest[uVar11 - 2] = uVar19;
            lVar17 = lVar17 + -0x200000000;
          }
          if (uVar11 != 0) {
            *(uint16_t *)((long)__dest + (lVar17 >> 0x1f) + -2) = uVar19;
          }
        }
        else {
          uVar11 = (ulong)(uVar22 - 8);
          __src = __dest + uVar11;
          auVar26 = pshuflw(ZEXT416((uint)uVar10),ZEXT416((uint)uVar10),0);
          uVar25 = auVar26._0_4_;
          *(undefined4 *)__src = uVar25;
          *(undefined4 *)(__src + 2) = uVar25;
          *(undefined4 *)(__src + 4) = uVar25;
          *(undefined4 *)(__src + 6) = uVar25;
          if (0xf < uVar22) {
            uVar11 = (ulong)(uVar22 - 0x10);
            puVar1 = __dest + uVar11;
            uVar5 = *(undefined8 *)(__src + 4);
            *(undefined8 *)puVar1 = *(undefined8 *)__src;
            *(undefined8 *)(puVar1 + 4) = uVar5;
            for (; 0xf < uVar11; uVar11 = uVar11 - 0x10) {
              uVar5 = *(undefined8 *)puVar1;
              uVar6 = *(undefined8 *)(puVar1 + 4);
              uVar7 = *(undefined8 *)(puVar1 + 0xc);
              *(undefined8 *)(puVar24 + (long)(int)uVar8 + (uVar11 - 8)) =
                   *(undefined8 *)(puVar1 + 8);
              *(undefined8 *)(puVar24 + (long)(int)uVar8 + (uVar11 - 8) + 4) = uVar7;
              *(undefined8 *)(puVar24 + (long)(int)uVar8 + (uVar11 - 0x10)) = uVar5;
              *(undefined8 *)(puVar24 + (long)(int)uVar8 + (uVar11 - 0x10) + 4) = uVar6;
            }
            uVar11 = uVar11 & 0xffffffff;
            __src = puVar1;
          }
          if ((int)uVar11 != 0) {
            memcpy(__dest,__src,uVar11 * 2);
          }
        }
      }
      else {
        iVar9 = (int)uVar8 >> ((byte)wVar23 & 0x1f);
        sVar4 = (short)wVar14;
        if (puVar24[iVar9] == 0) {
          wVar15 = hf->tree_used;
          puVar24[iVar9] = (short)wVar15 + sVar4;
          phVar12 = hf->tree;
          wVar20 = wVar15 + L'\x01';
          hf->tree_used = wVar20;
          if (hf->tree_avail <= wVar15) {
            return L'\0';
          }
          phVar16 = phVar12 + wVar15;
          phVar16->left = 0;
          phVar16->right = 0;
        }
        else {
          wVar15 = (wchar_t)puVar24[iVar9];
          if (wVar15 < wVar14) {
            return L'\0';
          }
          wVar20 = hf->tree_used;
          if (wVar20 + wVar14 <= wVar15) {
            return L'\0';
          }
          phVar12 = hf->tree;
          phVar16 = phVar12 + (wVar15 - wVar14);
        }
        uVar22 = 1 << ((byte)wVar23 - 1 & 0x1f);
        for (iVar9 = bVar13 - 10; 1 < iVar9; iVar9 = iVar9 + -1) {
          if ((uVar22 & 0xffff & uVar8) == 0) {
            uVar2 = phVar16->right;
            if (wVar14 <= (int)(uint)uVar2) goto LAB_00544a2c;
            phVar16->right = (short)wVar20 + sVar4;
LAB_00544a16:
            hf->tree_used = wVar20 + L'\x01';
            if (hf->tree_avail <= wVar20) {
              return L'\0';
            }
            phVar16 = phVar12 + wVar20;
            phVar16->left = 0;
            phVar16->right = 0;
            wVar20 = wVar20 + L'\x01';
          }
          else {
            uVar2 = phVar16->left;
            if ((int)(uint)uVar2 < wVar14) {
              phVar16->left = (short)wVar20 + sVar4;
              goto LAB_00544a16;
            }
LAB_00544a2c:
            phVar16 = phVar12 + ((ulong)uVar2 - (long)wVar14);
          }
          uVar22 = (uVar22 & 0xffff) >> 1;
        }
        if ((ushort)((ushort)uVar8 & (ushort)uVar22) == 0) {
          if (phVar16->right != 0) {
            return L'\0';
          }
          phVar16->right = uVar19;
        }
        else {
          if (phVar16->left != 0) {
            return L'\0';
          }
          phVar16->left = uVar19;
        }
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

static int
lzh_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int diffbits, len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if (ptn != 0x10000 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}
	if (maxbits > HTBL_BITS) {
		unsigned htbl_max;
		uint16_t *p;

		diffbits = maxbits - HTBL_BITS;
		for (i = 1; i <= HTBL_BITS; i++) {
			bitptn[i] >>= diffbits;
			weight[i] >>= diffbits;
		}
		htbl_max = bitptn[HTBL_BITS] +
		    weight[HTBL_BITS] * hf->freq[HTBL_BITS];
		p = &(hf->tbl[htbl_max]);
		while (p < &hf->tbl[1U<<HTBL_BITS])
			*p++ = 0;
	} else
		diffbits = 0;
	hf->shift_bits = diffbits;

	/*
	 * Make the table.
	 */
	tbl_size = 1 << HTBL_BITS;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_avail;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;
		uint16_t bit;
		int extlen;
		struct htree_t *ht;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		ptn = bitptn[len];
		cnt = weight[len];
		if (len <= HTBL_BITS) {
			/* Calculate next bit pattern */
			if ((bitptn[len] = ptn + cnt) > tbl_size)
				return (0);/* Invalid */
			/* Update the table */
			p = &(tbl[ptn]);
			if (cnt > 7) {
				uint16_t *pc;

				cnt -= 8;
				pc = &p[cnt];
				pc[0] = (uint16_t)i;
				pc[1] = (uint16_t)i;
				pc[2] = (uint16_t)i;
				pc[3] = (uint16_t)i;
				pc[4] = (uint16_t)i;
				pc[5] = (uint16_t)i;
				pc[6] = (uint16_t)i;
				pc[7] = (uint16_t)i;
				if (cnt > 7) {
					cnt -= 8;
					memcpy(&p[cnt], pc,
						8 * sizeof(uint16_t));
					pc = &p[cnt];
					while (cnt > 15) {
						cnt -= 16;
						memcpy(&p[cnt], pc,
							16 * sizeof(uint16_t));
					}
				}
				if (cnt)
					memcpy(p, pc, cnt * sizeof(uint16_t));
			} else {
				while (cnt > 1) {
					p[--cnt] = (uint16_t)i;
					p[--cnt] = (uint16_t)i;
				}
				if (cnt)
					p[--cnt] = (uint16_t)i;
			}
			continue;
		}

		/*
		 * A bit length is too big to be housed to a direct table,
		 * so we use a tree model for its extra bits.
		 */
		bitptn[len] = ptn + cnt;
		bit = 1U << (diffbits -1);
		extlen = len - HTBL_BITS;
		
		p = &(tbl[ptn >> diffbits]);
		if (*p == 0) {
			*p = len_avail + hf->tree_used;
			ht = &(hf->tree[hf->tree_used++]);
			if (hf->tree_used > hf->tree_avail)
				return (0);/* Invalid */
			ht->left = 0;
			ht->right = 0;
		} else {
			if (*p < len_avail ||
			    *p >= (len_avail + hf->tree_used))
				return (0);/* Invalid */
			ht = &(hf->tree[*p - len_avail]);
		}
		while (--extlen > 0) {
			if (ptn & bit) {
				if (ht->left < len_avail) {
					ht->left = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->left - len_avail]);
				}
			} else {
				if (ht->right < len_avail) {
					ht->right = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->right - len_avail]);
				}
			}
			bit >>= 1;
		}
		if (ptn & bit) {
			if (ht->left != 0)
				return (0);/* Invalid */
			ht->left = (uint16_t)i;
		} else {
			if (ht->right != 0)
				return (0);/* Invalid */
			ht->right = (uint16_t)i;
		}
	}
	return (1);
}